

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shifts.c
# Opt level: O0

uint32_t arm_shift(status_register_t *cpsr,shift_type_t type,uint32_t data,uint32_t shift_amount)

{
  uint32_t in_ECX;
  uint32_t in_EDX;
  uint in_ESI;
  status_register_t *in_RDI;
  uint32_t in_stack_ffffffffffffffe0;
  uint32_t local_4;
  
  switch(in_ESI) {
  case 0:
    local_4 = arm_lsl((status_register_t *)CONCAT44(in_ESI,in_EDX),in_ECX,in_stack_ffffffffffffffe0)
    ;
    break;
  case 1:
    local_4 = arm_lsr((status_register_t *)CONCAT44(in_ESI,in_EDX),in_ECX,in_stack_ffffffffffffffe0)
    ;
    break;
  case 2:
    local_4 = arm_asr(in_RDI,in_EDX,in_ECX);
    break;
  case 3:
    local_4 = arm_ror(in_RDI,in_EDX,in_ECX);
    break;
  default:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/shifts.c",
            0x6f);
    fprintf(_stderr,"Unknown shift type: %d\n\x1b[0;m",(ulong)in_ESI);
    exit(1);
  }
  return local_4;
}

Assistant:

word arm_shift(status_register_t* cpsr, shift_type_t type, word data, word shift_amount) {
    switch (type) {
        case LSL:
            return arm_lsl(cpsr, data, shift_amount);
        case LSR:
            return arm_lsr(cpsr, data, shift_amount);
        case ASR:
            return arm_asr(cpsr, data, shift_amount);
        case ROR:
            return arm_ror(cpsr, data, shift_amount);
        default:
            logfatal("Unknown shift type: %d", type)
    }
}